

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall
helics::BrokerBase::setLogLevels(BrokerBase *this,int32_t consoleLevel,int32_t fileLevel)

{
  int iVar1;
  LogManager *in_RDI;
  memory_order __b;
  int32_t in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  LogManager *this_00;
  
  this_00 = (LogManager *)
            ((long)&in_RDI[1].mLogBuffer.mBuffer.m_obj.
                    super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start + 0x10);
  CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x534d8c);
  LogManager::setLogLevels(in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x534db4);
  iVar1 = LogManager::getMaxLevel(this_00);
  std::operator&(seq_cst,__memory_order_mask);
  LOCK();
  *(int *)((long)&(in_RDI->logIdentifier).field_2 + 4) = iVar1;
  UNLOCK();
  return;
}

Assistant:

void BrokerBase::setLogLevels(int32_t consoleLevel, int32_t fileLevel)
{
    mLogManager->setLogLevels(consoleLevel, fileLevel);
    maxLogLevel.store(mLogManager->getMaxLevel());
}